

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pkg_genc.cpp
# Opt level: O3

UBool checkAssemblyHeaderName(char *optAssembly)

{
  int iVar1;
  int8_t *piVar2;
  long lVar3;
  
  assemblyHeaderIndex = -1;
  piVar2 = &assemblyHeader[0].hexType;
  lVar3 = 0;
  do {
    iVar1 = strcmp(optAssembly,((AssemblyType *)(piVar2 + -0x20))->name);
    if (iVar1 == 0) {
      assemblyHeaderIndex = (int32_t)lVar3;
      hexType = (int)*piVar2;
      return '\x01';
    }
    lVar3 = lVar3 + 1;
    piVar2 = piVar2 + 0x28;
  } while (lVar3 != 10);
  return '\0';
}

Assistant:

U_CAPI UBool U_EXPORT2
checkAssemblyHeaderName(const char* optAssembly) {
    int32_t idx;
    assemblyHeaderIndex = -1;
    for (idx = 0; idx < UPRV_LENGTHOF(assemblyHeader); idx++) {
        if (uprv_strcmp(optAssembly, assemblyHeader[idx].name) == 0) {
            assemblyHeaderIndex = idx;
            hexType = assemblyHeader[idx].hexType; /* set the hex type */
            return TRUE;
        }
    }

    return FALSE;
}